

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O1

QCborValueRef
QCborContainerPrivate::findOrAddMapKey<QCborValue_const&>
          (QCborContainerPrivate *container,QCborValue *key)

{
  int iVar1;
  undefined4 extraout_var;
  void *in_RCX;
  long in_RDX;
  void *__child_stack;
  void *pvVar2;
  long lVar3;
  long in_FS_OFFSET;
  QCborValueConstRef QVar4;
  QCborValueRef QVar5;
  QCborValue local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (container == (QCborContainerPrivate *)0x0) {
    lVar3 = 1;
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)(container->elements).d.size;
    QVar4 = findCborMapKey<QCborValue_const&>(container,key);
    in_RDX = QVar4.i;
    lVar3 = in_RDX;
  }
  __child_stack = (void *)(lVar3 + 1);
  if (lVar3 + 1 <= (long)pvVar2) {
    __child_stack = pvVar2;
  }
  if ((container == (QCborContainerPrivate *)0x0) ||
     ((container->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i != 1)) {
    iVar1 = clone((__fn *)container,__child_stack,(int)in_RDX,in_RCX);
    container = (QCborContainerPrivate *)CONCAT44(extraout_var,iVar1);
  }
  if ((long)pvVar2 <= lVar3) {
    insertAt(container,(container->elements).d.size,key,CopyContainer);
    local_48.n = 0;
    local_48.container = (QCborContainerPrivate *)0x0;
    local_48.t = Undefined;
    insertAt(container,(container->elements).d.size,&local_48,MoveContainer);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar5.super_QCborValueConstRef.i = lVar3;
    QVar5.super_QCborValueConstRef.d = container;
    return (QCborValueRef)QVar5.super_QCborValueConstRef;
  }
  __stack_chk_fail();
}

Assistant:

static QCborValueRef
    findOrAddMapKey(QCborContainerPrivate *container, KeyType key)
    {
        qsizetype size = 0;
        qsizetype index = size + 1;
        if (container) {
            size = container->elements.size();
            index = container->findCborMapKey<KeyType>(key).i; // returns size + 1 if not found
        }
        Q_ASSERT(index & 1);
        Q_ASSERT((size & 1) == 0);

        container = detach(container, qMax(index + 1, size));
        Q_ASSERT(container);
        Q_ASSERT((container->elements.size() & 1) == 0);

        if (index >= size) {
            container->append(key);
            container->append(QCborValue());
        }
        Q_ASSERT(index < container->elements.size());
        return { container, index };
    }